

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_CheckIfTargetInLOS
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double dVar2;
  AActor *t1;
  bool bVar3;
  bool bVar4;
  AActor *pAVar5;
  uint uVar6;
  int val;
  char *pcVar7;
  long lVar8;
  AActor *this;
  AActor *t2;
  undefined4 uVar9;
  undefined4 uVar10;
  uint uVar11;
  double dVar12;
  double dVar13;
  undefined1 local_68 [16];
  DAngle local_58;
  FTranslatedLineTarget t;
  
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_003e7215;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e7205:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e7215:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1095,
                  "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003e6cc1;
    bVar3 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar3) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e7215;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003e7205;
LAB_003e6cc1:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e7284:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1096,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar9 = (undefined4)*(undefined8 *)&param[1].field_0;
    uVar10 = (undefined4)((ulong)*(undefined8 *)&param[1].field_0 >> 0x20);
LAB_003e6d20:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e72a3:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1097,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar6 = param[2].field_0.i;
LAB_003e6d2f:
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e7253:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1098,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    dVar12 = param[3].field_0.f;
LAB_003e6d40:
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e7234:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1099,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e7284;
    }
    uVar9 = (undefined4)*(undefined8 *)&param[1].field_0;
    uVar10 = (undefined4)((ulong)*(undefined8 *)&param[1].field_0 >> 0x20);
    if ((uint)numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003e6d20;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e72a3;
    }
    uVar6 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003e6d2f;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e7253;
    }
    dVar12 = param[3].field_0.f;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003e6d40;
    }
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e7234;
    }
  }
  dVar1 = param[4].field_0.f;
  if (this->player == (player_t *)0x0) {
    lVar8 = 0x280;
    if ((((uVar6 & 0x40) == 0) &&
        ((((uVar6 & 1) != 0 && ((this->flags).Value & 0x10000) != 0 ||
          (lVar8 = 0x208, (uVar6 & 0x1000) != 0)) &&
         (lVar8 = 0x278, ((this->flags2).Value & 0x40000000) == 0 && (uVar6 & 0x1000) == 0)))) ||
       (pAVar5 = GC::ReadBarrier<AActor>
                           ((AActor **)
                            ((long)&(this->super_DThinker).super_DObject._vptr_DObject + lVar8)),
       pAVar5 == (AActor *)0x0)) {
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x10b4,
                      "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      goto LAB_003e6ffe;
    }
    if (((uVar6 & 0x20) != 0) && (pAVar5->health < 1)) {
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x10b8,
                      "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      goto LAB_003e6ffe;
    }
    bVar3 = (uVar6 & 2) == 0;
    goto LAB_003e6f28;
  }
  local_68._8_8_ = (this->Angles).Yaw.Degrees;
  uVar11 = 0;
  if ((uVar6 >> 0xb & 1) != 0) {
    uVar11 = 0x3fe00000;
  }
  local_58.Degrees = (double)((ulong)uVar11 << 0x20);
  P_AimLineAttack((AActor *)local_68,(DAngle *)this,2048.0,(FTranslatedLineTarget *)(local_68 + 8),
                  (DAngle *)&t,(int)&local_58,(AActor *)&DAT_00000020,(AActor *)0x0);
  if (t.linetarget == (AActor *)0x0) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x10c4,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    goto LAB_003e6ffe;
  }
  pAVar5 = t.linetarget;
  switch(uVar6 >> 7 & 3) {
  case 0:
    uVar9 = 0;
    uVar10 = 0;
    bVar3 = false;
    break;
  case 1:
    goto LAB_003e6f21;
  case 2:
    bVar3 = false;
    break;
  case 3:
    uVar9 = 0;
    uVar10 = 0;
LAB_003e6f21:
    bVar3 = (uVar6 & 2) == 0;
  }
LAB_003e6f28:
  if ((((uVar6 >> 10 & 1) == 0) || (pAVar5->player != (player_t *)0x0)) ||
     (((pAVar5->flags3).Value & 0x2000) != 0)) {
    dVar13 = (double)CONCAT44(uVar10,uVar9);
    if (((uVar6 >> 9 & 1) == 0) || (bVar4 = AActor::IsFriend(this,pAVar5), !bVar4)) {
      dVar2 = AActor::Distance3D(this,pAVar5,false);
      if (((dVar12 == 0.0) && (!NAN(dVar12))) || (dVar2 <= dVar12)) {
        if (((dVar1 != 0.0) || (NAN(dVar1))) && (dVar2 < dVar1)) {
          if ((uVar6 & 0x10) != 0) {
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x10ef,
                            "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            goto LAB_003e6ffe;
          }
          if ((uVar6 & 4) != 0) {
            dVar13 = 0.0;
          }
          bVar3 = (bool)(bVar3 & (uVar6 & 8) == 0);
        }
        t2 = pAVar5;
        t1 = this;
        if ((char)uVar6 < '\0') {
          t2 = this;
          t1 = pAVar5;
        }
        if ((!bVar3) || (bVar3 = P_CheckSight(t1,t2,1), bVar3)) {
          if (360.0 <= dVar13) {
            dVar13 = 360.0;
          }
          if (0.0 < dVar13) {
            if (t1 == this) {
              this = t2;
            }
            if ((uVar6 >> 8 & 1) == 0) {
              this = t1;
              t1 = t2;
            }
            AActor::AngleTo((AActor *)local_68,this,SUB81(t1,0));
            if (dVar13 * 0.5 <
                ABS((double)SUB84(((double)local_68._0_8_ - (this->Angles).Yaw.Degrees) *
                                  11930464.711111112 + 6755399441055744.0,0) * 8.381903171539307e-08
                   )) {
              if (numret < 1) {
                return 0;
              }
              if (ret == (VMReturn *)0x0) {
                __assert_fail("ret != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x110e,
                              "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              goto LAB_003e6ffe;
            }
          }
          if (0 < numret) {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x1111,
                            "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            val = 1;
            goto LAB_003e71e9;
          }
        }
        else if (0 < numret) {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x10fd,
                          "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          val = 0;
LAB_003e71e9:
          VMReturn::SetInt(ret,val);
          return 1;
        }
      }
      else if (0 < numret) {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x10e9,
                        "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        goto LAB_003e6ffe;
      }
    }
    else if (0 < numret) {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x10e3,
                      "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      goto LAB_003e6ffe;
    }
  }
  else if (0 < numret) {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x10de,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
LAB_003e6ffe:
    VMReturn::SetInt(ret,0);
    return 1;
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckIfTargetInLOS)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE_DEF	(fov)		
	PARAM_INT_DEF	(flags)		
	PARAM_FLOAT_DEF	(dist_max)	
	PARAM_FLOAT_DEF	(dist_close)

	AActor *target, *viewport;
	FTranslatedLineTarget t;

	bool doCheckSight;

	if (!self->player)
	{
		if (flags & JLOSF_CHECKMASTER)
		{
			target = self->master;
		}
		else if ((self->flags & MF_MISSILE && (flags & JLOSF_PROJECTILE)) || (flags & JLOSF_CHECKTRACER))
		{
			if ((self->flags2 & MF2_SEEKERMISSILE) || (flags & JLOSF_CHECKTRACER))
				target = self->tracer;
			else
				target = NULL;
		}
		else
		{
			target = self->target;
		}

		if (target == NULL)
		{ // [KS] Let's not call P_CheckSight unnecessarily in this case.
			ACTION_RETURN_BOOL(false);
		}
		if ((flags & JLOSF_DEADNOJUMP) && (target->health <= 0))
		{
			ACTION_RETURN_BOOL(false);
		}

		doCheckSight = !(flags & JLOSF_NOSIGHT);
	}
	else
	{
		// Does the player aim at something that can be shot?
		P_AimLineAttack(self, self->Angles.Yaw, MISSILERANGE, &t, (flags & JLOSF_NOAUTOAIM) ? 0.5 : 0., ALF_PORTALRESTRICT);
		
		if (!t.linetarget)
		{
			ACTION_RETURN_BOOL(false);
		}
		target = t.linetarget;

		switch (flags & (JLOSF_TARGETLOS|JLOSF_FLIPFOV))
		{
		case JLOSF_TARGETLOS|JLOSF_FLIPFOV:
			// target makes sight check, player makes fov check; player has verified fov
			fov = 0.;
			// fall-through
		case JLOSF_TARGETLOS:
			doCheckSight = !(flags & JLOSF_NOSIGHT); // The target is responsible for sight check and fov
			break;
		default:
			// player has verified sight and fov
			fov = 0.;
			// fall-through
		case JLOSF_FLIPFOV: // Player has verified sight, but target must verify fov
			doCheckSight = false;
			break;
		}
	}

	// [FDARI] If target is not a combatant, don't jump
	if ( (flags & JLOSF_COMBATANTONLY) && (!target->player) && !(target->flags3 & MF3_ISMONSTER))
	{
		ACTION_RETURN_BOOL(false);
	}
	// [FDARI] If actors share team, don't jump
	if ((flags & JLOSF_ALLYNOJUMP) && self->IsFriend(target))
	{
		ACTION_RETURN_BOOL(false);
	}
	double distance = self->Distance3D(target);

	if (dist_max && (distance > dist_max))
	{
		ACTION_RETURN_BOOL(false);
	}
	if (dist_close && (distance < dist_close))
	{
		if (flags & JLOSF_CLOSENOJUMP)
		{
			ACTION_RETURN_BOOL(false);
		}
		if (flags & JLOSF_CLOSENOFOV)
			fov = 0.;

		if (flags & JLOSF_CLOSENOSIGHT)
			doCheckSight = false;
	}

	if (flags & JLOSF_TARGETLOS) { viewport = target; target = self; }
	else { viewport = self; }

	if (doCheckSight && !P_CheckSight (viewport, target, SF_IGNOREVISIBILITY))
	{
		ACTION_RETURN_BOOL(false);
	}

	if (flags & JLOSF_FLIPFOV)
	{
		if (viewport == self) { viewport = target; target = self; }
		else { target = viewport; viewport = self; }
	}

	fov = MIN<DAngle>(fov, 360.);

	if (fov > 0)
	{
		DAngle an = absangle(viewport->AngleTo(target), viewport->Angles.Yaw);

		if (an > (fov / 2))
		{
			ACTION_RETURN_BOOL(false); // [KS] Outside of FOV - return
		}
	}
	ACTION_RETURN_BOOL(true);
}